

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O1

void ugolemeffects(int damtype,int dam)

{
  int iVar1;
  
  if ((u.umonnum == 0x10a) || (u.umonnum == 0x106)) {
    if (damtype == 2) {
      iVar1 = 0;
      if (u.umonnum == 0x10a) {
        iVar1 = dam;
      }
    }
    else {
      iVar1 = 0;
      if ((damtype == 6) && (u.umonnum == 0x106)) {
        iVar1 = dam / 6;
      }
    }
    if (iVar1 != 0) {
      if (u.mh < u.mhmax) {
        u.mh = u.mh + iVar1;
        if (u.mhmax <= u.mh) {
          u.mh = u.mhmax;
        }
        iflags.botl = '\x01';
        pline("Strangely, you feel better than before.");
        exercise(0,'\x01');
        return;
      }
    }
  }
  return;
}

Assistant:

void ugolemeffects(int damtype, int dam)
{
	int heal = 0;
	/* We won't bother with "slow"/"haste" since players do not
	 * have a monster-specific slow/haste so there is no way to
	 * restore the old velocity once they are back to human.
	 */
	if (u.umonnum != PM_FLESH_GOLEM && u.umonnum != PM_IRON_GOLEM)
		return;
	switch (damtype) {
		case AD_ELEC: if (u.umonnum == PM_FLESH_GOLEM)
				heal = dam / 6; /* Approx 1 per die */
			break;
		case AD_FIRE: if (u.umonnum == PM_IRON_GOLEM)
				heal = dam;
			break;
	}
	if (heal && (u.mh < u.mhmax)) {
		u.mh += heal;
		if (u.mh > u.mhmax) u.mh = u.mhmax;
		iflags.botl = 1;
		pline("Strangely, you feel better than before.");
		exercise(A_STR, TRUE);
	}
}